

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O2

string * __thiscall
Catch::StringMaker<signed_char,void>::convert_abi_cxx11_
          (string *__return_storage_ptr__,StringMaker<signed_char,void> *this,char value)

{
  undefined7 in_register_00000011;
  allocator *paVar1;
  char *pcVar2;
  char chstr [4];
  allocator local_11;
  allocator local_10;
  allocator local_f;
  allocator local_e;
  allocator local_d;
  char local_c;
  byte bStack_b;
  undefined2 uStack_a;
  
  switch((int)this) {
  case 9:
    pcVar2 = "\'\\t\'";
    paVar1 = &local_10;
    break;
  case 10:
    pcVar2 = "\'\\n\'";
    paVar1 = &local_f;
    break;
  default:
    if ((byte)this < 0x20) {
      StringMaker<unsigned_long_long,void>::convert_abi_cxx11_
                (__return_storage_ptr__,(StringMaker<unsigned_long_long,void> *)(long)(int)this,
                 CONCAT71(in_register_00000011,value));
      return __return_storage_ptr__;
    }
    pcVar2 = &local_c;
    _local_c = CONCAT22(0x27,CONCAT11((byte)this,0x27));
    paVar1 = &local_11;
    break;
  case 0xc:
    pcVar2 = "\'\\f\'";
    paVar1 = &local_e;
    break;
  case 0xd:
    pcVar2 = "\'\\r\'";
    paVar1 = &local_d;
  }
  std::__cxx11::string::string((string *)__return_storage_ptr__,pcVar2,paVar1);
  return __return_storage_ptr__;
}

Assistant:

std::string StringMaker<signed char>::convert(signed char value) {
    if (value == '\r') {
        return "'\\r'";
    } else if (value == '\f') {
        return "'\\f'";
    } else if (value == '\n') {
        return "'\\n'";
    } else if (value == '\t') {
        return "'\\t'";
    } else if ('\0' <= value && value < ' ') {
        return ::Catch::Detail::stringify(static_cast<unsigned int>(value));
    } else {
        char chstr[] = "' '";
        chstr[1] = value;
        return chstr;
    }
}